

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O2

void __thiscall
EOPlus::Parser::ParseRuleActionBlock
          (Parser *this,deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_> *rules,
          deque<EOPlus::Action,_std::allocator<EOPlus::Action>_> *actions,
          function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *custom_handler,
          function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
          *error_handler)

{
  Expression *pEVar1;
  variant *this_00;
  Parser_Token_Server_Base *pPVar2;
  Token *pTVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  Token t;
  string local_500;
  Token local_4e0;
  Token local_490;
  undefined1 local_440 [64];
  Action action;
  Rule rule;
  
  util::variant::variant((variant *)local_440);
  Token::Token(&t,Invalid,(variant *)local_440);
  std::__cxx11::string::~string((string *)(local_440 + 0x10));
  this_00 = &t.data;
  pEVar1 = &rule.action.expr;
LAB_00131088:
  do {
    while( true ) {
      bVar4 = GetToken(this,&t,0x41);
      if (!bVar4) goto LAB_001313db;
      if (t.type != Symbol) break;
      util::variant::GetString_abi_cxx11_((string *)&rule,this_00);
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &rule,"}");
      std::__cxx11::string::~string((string *)&rule);
      if (bVar4) goto LAB_0013140d;
      util::variant::GetString_abi_cxx11_((string *)&rule,this_00);
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &rule,";");
      std::__cxx11::string::~string((string *)&rule);
      if (!bVar4) {
        pPVar2 = (this->tok)._M_t.
                 super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                 .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
        Token::Token(&local_4e0,&t);
        Parser_Token_Server_Base::PutBack(pPVar2,&local_4e0);
        pTVar3 = &local_4e0;
LAB_001313d6:
        std::__cxx11::string::~string((string *)&(pTVar3->data).val_string);
LAB_001313db:
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_570,"rule/action/if/elseif/else",(allocator<char> *)&rule);
        std::
        function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
        ::operator()(error_handler,&local_570);
        std::__cxx11::string::~string((string *)&local_570);
LAB_0013140d:
        std::__cxx11::string::~string((string *)&t.data.val_string);
        return;
      }
    }
  } while (t.type != Identifier);
  util::variant::GetString_abi_cxx11_((string *)&rule,this_00);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rule
                          ,"rule");
  std::__cxx11::string::~string((string *)&rule);
  if (bVar4) {
    ParseRule(&rule,this);
    std::deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>::emplace_back<EOPlus::Rule>(rules,&rule)
    ;
  }
  else {
    util::variant::GetString_abi_cxx11_((string *)&rule,this_00);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &rule,"action");
    std::__cxx11::string::~string((string *)&rule);
    if (bVar4) {
      ParseAction((Action *)&rule,this);
      std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::emplace_back<EOPlus::Action>
                (actions,(Action *)&rule);
LAB_00131194:
      Action::~Action((Action *)&rule);
      goto LAB_00131088;
    }
    util::variant::GetString_abi_cxx11_((string *)&rule,this_00);
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &rule,"if");
    std::__cxx11::string::~string((string *)&rule);
    if (bVar4) {
      ParseRule(&rule,this);
      Action::Action(&action);
      action.cond = If;
      Expression::operator=(&action.cond_expr,&rule.expr);
      Expression::operator=(&action.expr,pEVar1);
      std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::push_back(actions,&action);
    }
    else {
      util::variant::GetString_abi_cxx11_((string *)&rule,this_00);
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &rule,"elseif");
      if (bVar4) {
        std::__cxx11::string::~string((string *)&rule);
      }
      else {
        util::variant::GetString_abi_cxx11_((string *)&action,this_00);
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&action,"elif");
        std::__cxx11::string::~string((string *)&action);
        std::__cxx11::string::~string((string *)&rule);
        if (!bVar4) {
          util::variant::GetString_abi_cxx11_((string *)&rule,this_00);
          bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&rule,"else");
          std::__cxx11::string::~string((string *)&rule);
          if (bVar4) {
            ParseAction((Action *)&rule,this);
            rule.expr.scopes.super__Deque_base<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>.
            _M_impl.super__Deque_impl_data._M_map._0_4_ = 2;
            std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::push_back
                      (actions,(value_type *)&rule);
            goto LAB_00131194;
          }
          util::variant::GetString_abi_cxx11_(&local_500,this_00);
          bVar4 = std::
                  function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                  ::operator()(custom_handler,&local_500);
          std::__cxx11::string::~string((string *)&local_500);
          if (!bVar4) {
            pPVar2 = (this->tok)._M_t.
                     super___uniq_ptr_impl<EOPlus::Parser_Token_Server_Base,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_EOPlus::Parser_Token_Server_Base_*,_std::default_delete<EOPlus::Parser_Token_Server_Base>_>
                     .super__Head_base<0UL,_EOPlus::Parser_Token_Server_Base_*,_false>._M_head_impl;
            Token::Token(&local_490,&t);
            Parser_Token_Server_Base::PutBack(pPVar2,&local_490);
            pTVar3 = &local_490;
            goto LAB_001313d6;
          }
          goto LAB_00131088;
        }
      }
      ParseRule(&rule,this);
      Action::Action(&action);
      action.cond = ElseIf;
      Expression::operator=(&action.cond_expr,&rule.expr);
      Expression::operator=(&action.expr,pEVar1);
      std::deque<EOPlus::Action,_std::allocator<EOPlus::Action>_>::push_back(actions,&action);
    }
    Action::~Action(&action);
  }
  Rule::~Rule(&rule);
  goto LAB_00131088;
}

Assistant:

void Parser::ParseRuleActionBlock(std::deque<Rule>& rules, std::deque<Action>& actions, std::function<bool(std::string)> custom_handler, std::function<void(std::string)> error_handler)
	{
		Token t;

		while (this->GetToken(t, Token::Identifier | Token::Symbol))
		{
			if (t.type == Token::Identifier)
			{
				if (std::string(t.data) == "rule")
				{
					rules.push_back(this->ParseRule());
				}
				else if (std::string(t.data) == "action")
				{
					actions.push_back(this->ParseAction());
				}
				else if (std::string(t.data) == "if")
				{
					Rule rule = this->ParseRule();
					Action action;
					action.cond = Action::If;
					action.cond_expr = rule.expr;
					action.expr = rule.action.expr;
					actions.push_back(action);
				}
				else if (std::string(t.data) == "elseif" || std::string(t.data) == "elif")
				{
					Rule rule = this->ParseRule();
					Action action;
					action.cond = Action::ElseIf;
					action.cond_expr = rule.expr;
					action.expr = rule.action.expr;
					actions.push_back(action);
				}
				else if (std::string(t.data) == "else")
				{
					Action action = this->ParseAction();
					action.cond = Action::Else;
					actions.push_back(action);
				}
				else
				{
					if (!custom_handler(std::string(t.data)))
					{
						this->tok->PutBack(t);
						break;
					}
				}
			}
			else if (t.type == Token::Symbol)
			{
				if (std::string(t.data) == "}")
				{
					return;
				}
				else if (std::string(t.data) == ";")
				{
					continue;
				}
				else
				{
					this->tok->PutBack(t);
					break;
				}
			}
		}

		// PARSER_ERROR_GOT("Expected rule-action-block entry (rule/action) or closing brace '}'.")
		error_handler("rule/action/if/elseif/else");
	}